

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

Data * __thiscall
chaiscript::json::JSON::Internal::make_type_abi_cxx11_
          (Data *__return_storage_ptr__,Internal *this,Class c)

{
  runtime_error *this_00;
  undefined4 in_register_00000014;
  bool local_89;
  long local_88;
  double local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_> local_58;
  QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>
  local_40;
  void *local_20;
  undefined4 local_14;
  Data *pDStack_10;
  Class c_local;
  
  local_14 = SUB84(this,0);
  pDStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    local_20 = (void *)0x0;
    std::
    variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
    ::variant<decltype(nullptr),void,void,decltype(nullptr),void>
              ((variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
                *)__return_storage_ptr__,&local_20);
    break;
  case 1:
    memset(&local_40.data,0,0x18);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_>_>
    ::vector(&local_40.data);
    std::
    variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
    ::
    variant<chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,void,void,chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,void>
              ((variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
                *)__return_storage_ptr__,&local_40);
    utility::
    QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>
    ::~QuickFlatMap(&local_40);
    break;
  case 2:
    memset(&local_58,0,0x18);
    std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>::vector(&local_58);
    std::
    variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
    ::
    variant<std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,void,void,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,void>
              ((variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
                *)__return_storage_ptr__,&local_58);
    std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>::~vector(&local_58)
    ;
    break;
  case 3:
    std::__cxx11::string::string((string *)&local_78);
    std::
    variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
    ::variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
              ((variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
                *)__return_storage_ptr__,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    break;
  case 4:
    local_80 = 0.0;
    std::
    variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
    ::variant<double,void,void,double,void>
              ((variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
                *)__return_storage_ptr__,&local_80);
    break;
  case 5:
    local_88 = 0;
    std::
    variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
    ::variant<long,void,void,long,void>
              ((variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
                *)__return_storage_ptr__,&local_88);
    break;
  case 6:
    local_89 = false;
    std::
    variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
    ::variant<bool,void,void,bool,void>
              ((variant<decltype(nullptr),chaiscript::utility::QuickFlatMap<std::__cxx11::string,chaiscript::json::JSON,std::equal_to<void>>,std::vector<chaiscript::json::JSON,std::allocator<chaiscript::json::JSON>>,std::__cxx11::string,double,long,bool>
                *)__return_storage_ptr__,&local_89);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10,this,CONCAT44(in_register_00000014,c));
    std::runtime_error::runtime_error(this_00,"unknown type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

static Data make_type(Class c) {
        switch (c) {
          case Class::Null:
            return nullptr;
          case Class::Object:
            return chaiscript::utility::QuickFlatMap<std::string, JSON>{};
          case Class::Array:
            return std::vector<JSON>{};
          case Class::String:
            return std::string{};
          case Class::Floating:
            return double{};
          case Class::Integral:
            return std::int64_t{};
          case Class::Boolean:
            return bool{};
        }
        throw std::runtime_error("unknown type");
      }